

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.hh
# Opt level: O3

void __thiscall tinyusdz::Stage::Stage(Stage *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->_root_nodes).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_root_nodes).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_root_nodes).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header;
  (this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->default_root_node = -1;
  LayerMetas::LayerMetas(&this->stage_metas);
  (this->_err)._M_dataplus._M_p = (pointer)&(this->_err).field_2;
  (this->_err)._M_string_length = 0;
  (this->_err).field_2._M_local_buf[0] = '\0';
  (this->_warn)._M_dataplus._M_p = (pointer)&(this->_warn).field_2;
  (this->_warn)._M_string_length = 0;
  (this->_warn).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->_prim_path_cache)._M_t._M_impl.super__Rb_tree_header;
  (this->_prim_path_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_prim_path_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_prim_path_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->_prim_path_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_prim_path_cache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->_prim_id_cache)._M_t._M_impl.super__Rb_tree_header;
  (this->_prim_id_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_prim_id_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_prim_id_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_prim_id_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_prim_id_cache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->_dirty = true;
  this->_prim_id_dirty = true;
  (this->_prim_id_allocator).freeList_.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->_prim_id_allocator).freeList_.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->_prim_id_allocator).freeList_.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->_prim_id_allocator).counter_ = 1;
  (this->_prim_id_allocator).dirty_ = true;
  return;
}

Assistant:

static Stage CreateInMemory() { return Stage(); }